

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-utils.cc
# Opt level: O3

File __thiscall mp::NLUtils::openf(NLUtils *this,string *fname,int Close,char *mode)

{
  char cVar1;
  FILE *pFVar2;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  char *in_R8;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,Close);
  this->_vptr_NLUtils = (_func_int **)0x0;
  if ((int)mode == 0) {
    pFVar2 = fopen((char *)*puVar3,in_R8);
    this->_vptr_NLUtils = (_func_int **)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      (**(code **)((fname->_M_dataplus)._M_p + 0x20))(fname,"can\'t open %s",*puVar3);
    }
    else {
      cVar1 = (**(code **)((fname->_M_dataplus)._M_p + 0x28))(fname);
      if (cVar1 != '\0') {
        (**(code **)((fname->_M_dataplus)._M_p + 0x18))(fname,"File %s\n",*puVar3);
      }
    }
  }
  else {
    remove((char *)*puVar3);
  }
  return (File)(FILE *)this;
}

Assistant:

File NLUtils::
openf(const std::string& fname, int Close, const char *mode)
{
  File f;
  if (Close) {
    std::remove(fname.c_str());
    return f;
  }
  f.Open(fname.c_str(), mode);
  if (!f) {
    log_warning("can't open %s", fname.c_str());
    return f;
  }
  if (if_show_filenames())
    log_message("File %s\n", fname.c_str());
  return f;
}